

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

bool __thiscall cali::Node::equals(Node *this,cali_id_t attr,Variant *v)

{
  uint64_t uVar1;
  uint64_t uVar2;
  _Bool _Var3;
  cali_variant_t lhs;
  cali_variant_t rhs;
  
  uVar1 = (this->m_data).m_v.type_and_size;
  uVar2 = (v->m_v).type_and_size;
  if (uVar1 == uVar2) {
    lhs.value.v_uint = (this->m_data).m_v.value.v_uint;
    lhs.type_and_size = uVar1;
    rhs.value.v_uint = (v->m_v).value.v_uint;
    rhs.type_and_size = uVar2;
    _Var3 = _cali_variant_value_eq(lhs,rhs);
  }
  else {
    _Var3 = false;
  }
  return (bool)(this->m_attribute == attr & _Var3);
}

Assistant:

bool equals(cali_id_t attr, const Variant& v) const { return m_data == v && m_attribute == attr; }